

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

TIntermAggregate * __thiscall
glslang::TParseContext::handleFunctionDefinition
          (TParseContext *this,TSourceLoc *loc,TFunction *function)

{
  TSymbolTable *this_00;
  TIntermediate *pTVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  TLinkType TVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *pcVar6;
  ulong uVar7;
  undefined4 extraout_var_03;
  TType *pTVar8;
  undefined4 extraout_var_04;
  TFunction *pTVar9;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  TIntermAggregate *pTVar10;
  undefined4 extraout_var_09;
  TVariable *this_01;
  undefined4 extraout_var_10;
  TIntermSymbol *pTVar11;
  TFunction *pTVar12;
  size_t s;
  long *local_128;
  TType local_110;
  TVariable *local_78;
  TVariable *variable;
  TParameter *param;
  TIntermAggregate *pTStack_60;
  int i;
  TIntermAggregate *paramNodes;
  long *local_30;
  TFunction *prevDec;
  TSymbol *symbol;
  TFunction *function_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  symbol = &function->super_TSymbol;
  function_local = (TFunction *)loc;
  loc_local = (TSourceLoc *)this;
  iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[6])();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  operator=(&this->currentCaller,
            (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
            CONCAT44(extraout_var,iVar4));
  this_00 = (this->super_TParseContextBase).symbolTable;
  iVar4 = (*symbol->_vptr_TSymbol[6])();
  pTVar9 = (TFunction *)CONCAT44(extraout_var_00,iVar4);
  prevDec = (TFunction *)
            TSymbolTable::find(this_00,(TString *)pTVar9,(bool *)0x0,(bool *)0x0,(int *)0x0);
  if (prevDec == (TFunction *)0x0) {
    local_128 = (long *)0x0;
  }
  else {
    iVar4 = (*(prevDec->super_TSymbol)._vptr_TSymbol[7])();
    local_128 = (long *)CONCAT44(extraout_var_01,iVar4);
  }
  pTVar12 = function_local;
  local_30 = local_128;
  if (local_128 == (long *)0x0) {
    iVar4 = (*symbol->_vptr_TSymbol[3])();
    pcVar6 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var_02,iVar4));
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar12,"can\'t find function",pcVar6,"");
    pTVar9 = pTVar12;
  }
  if ((local_30 != (long *)0x0) &&
     (uVar7 = (**(code **)(*local_30 + 0xe8))(), pTVar12 = function_local, (uVar7 & 1) != 0)) {
    iVar4 = (*symbol->_vptr_TSymbol[3])();
    pcVar6 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var_03,iVar4));
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar12,"function already has a body",pcVar6,"");
    pTVar9 = pTVar12;
  }
  if ((local_30 == (long *)0x0) || (uVar7 = (**(code **)(*local_30 + 0xe8))(), (uVar7 & 1) != 0)) {
    pTVar8 = (TType *)TType::operator_new((TType *)0x98,(size_t)pTVar9);
    TType::TType(pTVar8,EbtVoid,EvqTemporary,1,0,0,false);
    (this->super_TParseContextBase).currentFunctionType = pTVar8;
  }
  else {
    (**(code **)(*local_30 + 0xe0))();
    pTVar8 = (TType *)(**(code **)(*local_30 + 0x60))();
    (this->super_TParseContextBase).currentFunctionType = pTVar8;
  }
  (this->super_TParseContextBase).functionReturnsValue = false;
  iVar4 = (*symbol->_vptr_TSymbol[3])();
  TIntermediate::getEntryPointName_abi_cxx11_
            ((this->super_TParseContextBase).super_TParseVersions.intermediate);
  pTVar9 = (TFunction *)std::__cxx11::string::c_str();
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  CONCAT44(extraout_var_04,iVar4),(char *)pTVar9);
  if (iVar4 == 0) {
    pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar4 = (*symbol->_vptr_TSymbol[6])();
    pTVar9 = (TFunction *)
             std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var_05,iVar4));
    TIntermediate::setEntryPointMangledName(pTVar1,(char *)pTVar9);
    TIntermediate::incrementEntryPointCount
              ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    this->inMain = true;
  }
  else {
    this->inMain = false;
  }
  if ((this->inMain & 1U) != 0) {
    iVar4 = (*symbol->_vptr_TSymbol[0x24])();
    pTVar12 = function_local;
    if (0 < iVar4) {
      iVar4 = (*symbol->_vptr_TSymbol[3])();
      pcVar6 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var_06,iVar4));
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar12,"function cannot take any parameter(s)",pcVar6,"");
      pTVar9 = pTVar12;
    }
    iVar4 = (*symbol->_vptr_TSymbol[0xc])();
    iVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar4) + 0x38))();
    pTVar12 = function_local;
    if (iVar4 != 0) {
      iVar4 = (*symbol->_vptr_TSymbol[0xc])();
      TType::getBasicTypeString_abi_cxx11_
                ((TString *)&paramNodes,(TType *)CONCAT44(extraout_var_08,iVar4));
      pcVar6 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)&paramNodes);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar12,"",pcVar6,"entry point cannot return a value");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    &paramNodes);
      pTVar9 = pTVar12;
    }
    TVar5 = TFunction::getLinkType((TFunction *)symbol);
    if (TVar5 != ELinkNone) {
      pTVar9 = function_local;
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,function_local,"main function cannot be exported","");
    }
  }
  TSymbolTable::push((this->super_TParseContextBase).symbolTable);
  pTVar10 = (TIntermAggregate *)TIntermNode::operator_new((TIntermNode *)0x188,(size_t)pTVar9);
  TIntermAggregate::TIntermAggregate(pTVar10);
  pTStack_60 = pTVar10;
  for (param._4_4_ = 0; uVar2 = param._4_4_, iVar4 = (*symbol->_vptr_TSymbol[0x24])(),
      pTVar10 = pTStack_60, (int)uVar2 < iVar4; param._4_4_ = param._4_4_ + 1) {
    s = (size_t)param._4_4_;
    iVar4 = (*symbol->_vptr_TSymbol[0x27])();
    pTVar10 = pTStack_60;
    variable = (TVariable *)CONCAT44(extraout_var_09,iVar4);
    if ((variable->super_TSymbol)._vptr_TSymbol == (_func_int **)0x0) {
      pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      pTVar11 = TIntermediate::addSymbol
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           (TType *)(variable->super_TSymbol).name,(TSourceLoc *)function_local);
      pTStack_60 = TIntermediate::growAggregate
                             (pTVar1,(TIntermNode *)pTVar10,(TIntermNode *)pTVar11,
                              (TSourceLoc *)function_local);
    }
    else {
      this_01 = (TVariable *)TSymbol::operator_new((TSymbol *)0xf8,s);
      TVariable::TVariable
                (this_01,(TString *)(variable->super_TSymbol)._vptr_TSymbol,
                 (TType *)(variable->super_TSymbol).name,false);
      local_78 = this_01;
      bVar3 = TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)this_01);
      pTVar9 = function_local;
      pTVar10 = pTStack_60;
      if (bVar3) {
        (variable->super_TSymbol)._vptr_TSymbol = (_func_int **)0x0;
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        pTVar11 = TIntermediate::addSymbol
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                             local_78,(TSourceLoc *)function_local);
        pTStack_60 = TIntermediate::growAggregate
                               (pTVar1,(TIntermNode *)pTVar10,(TIntermNode *)pTVar11,
                                (TSourceLoc *)function_local);
      }
      else {
        iVar4 = (*(local_78->super_TSymbol)._vptr_TSymbol[3])();
        pcVar6 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)CONCAT44(extraout_var_10,iVar4));
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar9,"redefinition",pcVar6,"");
      }
    }
  }
  TVar5 = TFunction::getLinkType((TFunction *)symbol);
  TIntermAggregate::setLinkType(pTVar10,TVar5);
  pTVar10 = pTStack_60;
  pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  TType::TType(&local_110,EbtVoid,EvqTemporary,1,0,0,false);
  TIntermediate::setAggregateOperator
            (pTVar1,(TIntermNode *)pTVar10,EOpParameters,&local_110,(TSourceLoc *)function_local);
  TType::~TType(&local_110);
  (this->super_TParseContextBase).loopNestingLevel = 0;
  (this->super_TParseContextBase).statementNestingLevel = 0;
  (this->super_TParseContextBase).controlFlowNestingLevel = 0;
  (this->super_TParseContextBase).postEntryPointReturn = false;
  return pTStack_60;
}

Assistant:

TIntermAggregate* TParseContext::handleFunctionDefinition(const TSourceLoc& loc, TFunction& function)
{
    currentCaller = function.getMangledName();
    TSymbol* symbol = symbolTable.find(function.getMangledName());
    TFunction* prevDec = symbol ? symbol->getAsFunction() : nullptr;

    if (! prevDec)
        error(loc, "can't find function", function.getName().c_str(), "");
    // Note:  'prevDec' could be 'function' if this is the first time we've seen function
    // as it would have just been put in the symbol table.  Otherwise, we're looking up
    // an earlier occurrence.

    if (prevDec && prevDec->isDefined()) {
        // Then this function already has a body.
        error(loc, "function already has a body", function.getName().c_str(), "");
    }
    if (prevDec && ! prevDec->isDefined()) {
        prevDec->setDefined();

        // Remember the return type for later checking for RETURN statements.
        currentFunctionType = &(prevDec->getType());
    } else
        currentFunctionType = new TType(EbtVoid);
    functionReturnsValue = false;

    // Check for entry point
    if (function.getName().compare(intermediate.getEntryPointName().c_str()) == 0) {
        intermediate.setEntryPointMangledName(function.getMangledName().c_str());
        intermediate.incrementEntryPointCount();
        inMain = true;
    } else
        inMain = false;

    //
    // Raise error message if main function takes any parameters or returns anything other than void
    //
    if (inMain) {
        if (function.getParamCount() > 0)
            error(loc, "function cannot take any parameter(s)", function.getName().c_str(), "");
        if (function.getType().getBasicType() != EbtVoid)
            error(loc, "", function.getType().getBasicTypeString().c_str(), "entry point cannot return a value");
        if (function.getLinkType() != ELinkNone)
            error(loc, "main function cannot be exported", "", "");
    }

    //
    // New symbol table scope for body of function plus its arguments
    //
    symbolTable.push();

    //
    // Insert parameters into the symbol table.
    // If the parameter has no name, it's not an error, just don't insert it
    // (could be used for unused args).
    //
    // Also, accumulate the list of parameters into the HIL, so lower level code
    // knows where to find parameters.
    //
    TIntermAggregate* paramNodes = new TIntermAggregate;
    for (int i = 0; i < function.getParamCount(); i++) {
        TParameter& param = function[i];
        if (param.name != nullptr) {
            TVariable *variable = new TVariable(param.name, *param.type);

            // Insert the parameters with name in the symbol table.
            if (! symbolTable.insert(*variable))
                error(loc, "redefinition", variable->getName().c_str(), "");
            else {
                // Transfer ownership of name pointer to symbol table.
                param.name = nullptr;

                // Add the parameter to the HIL
                paramNodes = intermediate.growAggregate(paramNodes,
                                                        intermediate.addSymbol(*variable, loc),
                                                        loc);
            }
        } else
            paramNodes = intermediate.growAggregate(paramNodes, intermediate.addSymbol(*param.type, loc), loc);
    }
    paramNodes->setLinkType(function.getLinkType());
    intermediate.setAggregateOperator(paramNodes, EOpParameters, TType(EbtVoid), loc);
    loopNestingLevel = 0;
    statementNestingLevel = 0;
    controlFlowNestingLevel = 0;
    postEntryPointReturn = false;

    return paramNodes;
}